

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O2

pint p_test_case_prwlock_bad_input_test(void)

{
  int iVar1;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  iVar1 = p_rwlock_reader_lock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x96);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_rwlock_reader_trylock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x97);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_rwlock_reader_unlock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x98);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_rwlock_writer_lock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x99);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_rwlock_writer_trylock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x9a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_rwlock_writer_unlock(0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/prwlock_test.cpp"
           ,0x9b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_rwlock_free(0);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (prwlock_bad_input_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_rwlock_reader_lock (NULL) == FALSE);
	P_TEST_CHECK (p_rwlock_reader_trylock (NULL) == FALSE);
	P_TEST_CHECK (p_rwlock_reader_unlock (NULL) == FALSE);
	P_TEST_CHECK (p_rwlock_writer_lock (NULL) == FALSE);
	P_TEST_CHECK (p_rwlock_writer_trylock (NULL) == FALSE);
	P_TEST_CHECK (p_rwlock_writer_unlock (NULL) == FALSE);
	p_rwlock_free (NULL);

	p_libsys_shutdown ();
}